

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

void PrintEnum(FLispString *out,ZCC_TreeNode *node)

{
  ZCC_TreeNode *this;
  char *local_40;
  FName local_24;
  ZCC_TreeNode *local_20;
  ZCC_Enum *enode;
  ZCC_TreeNode *node_local;
  FLispString *out_local;
  
  local_20 = node;
  enode = (ZCC_Enum *)node;
  node_local = (ZCC_TreeNode *)out;
  FLispString::Break(out);
  FLispString::Open((FLispString *)node_local,"enum");
  this = node_local;
  FName::FName(&local_24,*(ENamedName *)&local_20[1].SiblingNext);
  FLispString::AddName((FLispString *)this,&local_24);
  PrintBuiltInType((FLispString *)node_local,
                   *(EZCCBuiltinType *)((long)&local_20[1].SiblingNext + 4));
  if (local_20[1].SiblingPrev == (ZCC_TreeNode *)0x0) {
    local_40 = "nil";
  }
  else {
    local_40 = "...";
  }
  FLispString::Add((FLispString *)node_local,local_40,3);
  FLispString::Close((FLispString *)node_local);
  return;
}

Assistant:

static void PrintEnum(FLispString &out, ZCC_TreeNode *node)
{
	ZCC_Enum *enode = (ZCC_Enum *)node;
	out.Break();
	out.Open("enum");
	out.AddName(enode->NodeName);
	PrintBuiltInType(out, enode->EnumType);
	out.Add(enode->Elements == NULL ? "nil" : "...", 3);
	out.Close();
}